

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O1

int ffgtcp(fitsfile *infptr,fitsfile *outfptr,int cpopt,int *status)

{
  int iVar1;
  long lVar2;
  long lVar3;
  HDUtracker HDU;
  HDUtracker local_5df0;
  
  if (*status == 0) {
    if (infptr == outfptr) {
      *status = 0x15c;
    }
    else {
      local_5df0.nHDU = 0;
      iVar1 = fftsad(infptr,&local_5df0,(int *)0x0,(char *)0x0);
      *status = iVar1;
      iVar1 = ffgtcpr(infptr,outfptr,cpopt,&local_5df0,status);
      *status = iVar1;
      lVar2 = (long)local_5df0.nHDU;
      if (0 < lVar2) {
        lVar3 = 0;
        do {
          free(local_5df0.filename[lVar3]);
          free(local_5df0.newFilename[lVar3]);
          lVar3 = lVar3 + 1;
        } while (lVar2 != lVar3);
      }
    }
    return *status;
  }
  return *status;
}

Assistant:

int ffgtcp(fitsfile *infptr,  /* input FITS file pointer                     */
	   fitsfile *outfptr, /* output FITS file pointer                    */
	   int        cpopt,  /* code specifying copy options:
				OPT_GCP_GPT (0) ==> copy only grouping table
				OPT_GCP_ALL (2) ==> recusrively copy members 
				                    and their members (if 
						    groups)                  */
	   int      *status)  /* return status code                          */

/*
  copy a grouping table, and optionally all its members, to a new FITS file.
  If the cpopt is set to OPT_GCP_GPT (copy grouping table only) then the 
  existing members have their GRPIDn and GRPLCn keywords updated to reflect 
  the existance of the new group, since they now belong to another group. If 
  cpopt is set to OPT_GCP_ALL (copy grouping table and members recursively) 
  then the original members are not updated; the new grouping table is 
  modified to include only the copied member HDUs and not the original members.

  Note that the recursive version of this function, ffgtcpr(), is called
  to perform the group table copy. In the case of cpopt == OPT_GCP_GPT
  ffgtcpr() does not actually use recursion.
*/

{
  int i;

  HDUtracker HDU;


  if(*status != 0) return(*status);

  /* make sure infptr and outfptr are not the same pointer */

  if(infptr == outfptr) *status = IDENTICAL_POINTERS;
  else
    {

      /* initialize the HDUtracker struct */
      
      HDU.nHDU = 0;
      
      *status = fftsad(infptr,&HDU,NULL,NULL);
      
      /* 
	 call the recursive form of this function to copy the grouping table. 
	 If the cpopt is OPT_GCP_GPT then there is actually no recursion
	 performed
      */

      *status = ffgtcpr(infptr,outfptr,cpopt,&HDU,status);
  
      /* free memory allocated for the HDUtracker struct */

      for(i = 0; i < HDU.nHDU; ++i) 
	{
	  free(HDU.filename[i]);
	  free(HDU.newFilename[i]);
	}
    }

  return(*status);
}